

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquerymgr.cc
# Opt level: O3

void __thiscall bdQueryManager::addPeer(bdQueryManager *this,bdId *id,uint32_t peerflags)

{
  _List_node_base *p_Var1;
  
  for (p_Var1 = (this->mLocalQueries).super__List_base<bdQuery_*,_std::allocator<bdQuery_*>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->mLocalQueries; p_Var1 = p_Var1->_M_next) {
    bdQuery::addPeer((bdQuery *)p_Var1[1]._M_next,id,peerflags);
  }
  return;
}

Assistant:

void bdQueryManager::addPeer(const bdId *id, uint32_t peerflags) {

#ifdef DEBUG_NODE_ACTIONS 
	fprintf(stderr, "bdQueryManager::addPeer(");
	mFns->bdPrintId(std::cerr, id);
	fprintf(stderr, ")\n");
#endif
	/* iterate through queries */
	std::list<bdQuery *>::iterator it;
	for (it = mLocalQueries.begin(); it != mLocalQueries.end(); it++)
		(*it)->addPeer(id, peerflags);
}